

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

char * mcpl_usage_progname(char *argv0)

{
  int iVar1;
  uint uVar2;
  int has_exe_suffix;
  size_t npn;
  char *bn;
  undefined2 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe2;
  undefined1 uVar3;
  size_t local_18;
  char *local_10;
  
  local_10 = mcpl_basename((char *)npn);
  local_18 = strlen(local_10);
  uVar3 = false;
  if (4 < local_18) {
    iVar1 = strcmp(local_10 + (local_18 - 4),".exe");
    in_stack_ffffffffffffffe2 = true;
    uVar3 = in_stack_ffffffffffffffe2;
    if (iVar1 != 0) {
      iVar1 = strcmp(local_10 + (local_18 - 4),".EXE");
      in_stack_ffffffffffffffe2 = iVar1 == 0;
      uVar3 = in_stack_ffffffffffffffe2;
    }
  }
  uVar2 = (uint)(byte)uVar3;
  if (uVar2 != 0) {
    local_18 = local_18 - 4;
    local_10[local_18] = '\0';
  }
  if ((local_18 == 0) || (*local_10 == '.')) {
    free(local_10);
    local_10 = mcpl_internal_malloc
                         (CONCAT44(uVar2,CONCAT13(uVar3,CONCAT12(in_stack_ffffffffffffffe2,
                                                                 in_stack_ffffffffffffffe0))));
    builtin_strncpy(local_10,"PROGNAME",9);
  }
  return local_10;
}

Assistant:

char* mcpl_usage_progname( const char * argv0 )
{
  //Basically return the basename, but with any trailing .exe/.EXE discarded.
  char * bn = mcpl_basename(argv0);
  size_t npn = strlen(bn);
  const int has_exe_suffix = ( npn > 4
                               && ( strcmp(bn+(npn-4),".exe")==0
                                    || strcmp(bn+(npn-4),".EXE")==0 ) );
  if ( has_exe_suffix ) {
    npn -= 4;
    bn[npn] = '\0';
  }
  //Fallback to PROGNAME if empty or starts with a dot:
  if ( npn == 0 || bn[0]=='.' ) {
    free(bn);
    bn = mcpl_internal_malloc(9);
    memcpy(bn,"PROGNAME",9);
  }
  return bn;
}